

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O1

void __thiscall
icu_63::TimeZoneNamesImpl::getDisplayNames
          (TimeZoneNamesImpl *this,UnicodeString *tzID,UTimeZoneNameType *types,int32_t numTypes,
          UDate date,UnicodeString *dest,UErrorCode *status)

{
  UErrorCode UVar1;
  UTimeZoneNameType type;
  bool bVar2;
  UErrorCode *pUVar3;
  UTimeZoneNameTypeIndex UVar4;
  UChar *pUVar5;
  ZNames *pZVar6;
  UTimeZoneNameType *pUVar7;
  char *pcVar8;
  long lVar9;
  bool bVar10;
  UnicodeString mzID;
  ConstChar16Ptr local_b8;
  UErrorCode *local_b0;
  UTimeZoneNameType *local_a8;
  UObject local_a0;
  UDate local_98;
  ZNames *local_90;
  long local_88;
  UChar *local_80;
  UnicodeString local_70;
  
  if ((*status < U_ILLEGAL_ARGUMENT_ERROR) &&
     (0x1f < (ushort)(tzID->fUnion).fStackFields.fLengthAndFlags)) {
    local_b0 = status;
    local_a8 = types;
    local_98 = date;
    umtx_lock_63((UMutex *)gDataMutex);
    pUVar3 = local_b0;
    local_90 = loadTimeZoneNames(this,tzID,local_b0);
    UVar1 = *pUVar3;
    umtx_unlock_63((UMutex *)gDataMutex);
    if (0 < numTypes && UVar1 < U_ILLEGAL_ARGUMENT_ERROR) {
      local_88 = (ulong)(uint)numTypes - 1;
      local_a0._vptr_UObject = (_func_int **)&PTR__UnicodeString_003e6fd8;
      pcVar8 = (char *)0x0;
      pUVar7 = local_a8;
      lVar9 = 0;
      do {
        type = pUVar7[lVar9];
        UVar4 = ZNames::getTZNameTypeIndex(type);
        if (UVar4 < UTZNM_INDEX_EXEMPLAR_LOCATION) {
          pUVar5 = (UChar *)0x0;
        }
        else {
          pUVar5 = local_90->fNames[(uint)UVar4];
        }
        if (pUVar5 == (UChar *)0x0) {
          if ((ZNames *)pcVar8 != (ZNames *)0x0) {
LAB_00205341:
            if (pcVar8 == "<empty>") {
              pcVar8 = "<empty>";
            }
            else {
              UVar4 = ZNames::getTZNameTypeIndex(type);
              if (UTZNM_INDEX_UNKNOWN < UVar4) {
                pUVar5 = ((ZNames *)pcVar8)->fNames[(uint)UVar4];
                goto LAB_00205367;
              }
            }
            pUVar5 = (UChar *)0x0;
            goto LAB_00205367;
          }
          local_70.super_Replaceable.super_UObject._vptr_UObject =
               (UObject)(UObject)local_a0._vptr_UObject;
          local_70.fUnion.fStackFields.fLengthAndFlags = 2;
          (*(this->super_TimeZoneNames).super_UObject._vptr_UObject[7])
                    (local_98,this,tzID,&local_70);
          bVar2 = true;
          pcVar8 = "<empty>";
          bVar10 = true;
          if (0x1f < (ushort)local_70.fUnion.fStackFields.fLengthAndFlags) {
            umtx_lock_63((UMutex *)gDataMutex);
            pUVar3 = local_b0;
            pZVar6 = loadMetaZoneNames(this,&local_70,local_b0);
            pcVar8 = (char *)pZVar6;
            if (*pUVar3 < U_ILLEGAL_ARGUMENT_ERROR) {
              pcVar8 = "<empty>";
            }
            bVar10 = *pUVar3 < U_ILLEGAL_ARGUMENT_ERROR;
            if (pZVar6 != (ZNames *)0x0) {
              pcVar8 = (char *)pZVar6;
            }
            umtx_unlock_63((UMutex *)gDataMutex);
          }
          UnicodeString::~UnicodeString(&local_70);
          pUVar7 = local_a8;
          if (bVar10) goto LAB_00205341;
        }
        else {
LAB_00205367:
          if (pUVar5 == (UChar *)0x0) {
            UnicodeString::setToBogus(dest);
          }
          else {
            local_b8.p_ = pUVar5;
            UnicodeString::setTo(dest,'\x01',&local_b8,-1);
            local_80 = local_b8.p_;
          }
          bVar2 = false;
        }
        if (bVar2) {
          return;
        }
        dest = dest + 1;
        bVar10 = local_88 != lVar9;
        lVar9 = lVar9 + 1;
      } while (bVar10);
    }
  }
  return;
}

Assistant:

void TimeZoneNamesImpl::getDisplayNames(const UnicodeString& tzID,
        const UTimeZoneNameType types[], int32_t numTypes,
        UDate date, UnicodeString dest[], UErrorCode& status) const {
    if (U_FAILURE(status)) return;

    if (tzID.isEmpty()) { return; }
    void* tznames = NULL;
    void* mznames = NULL;
    TimeZoneNamesImpl *nonConstThis = const_cast<TimeZoneNamesImpl*>(this);

    // Load the time zone strings
    {
        Mutex lock(&gDataMutex);
        tznames = (void*) nonConstThis->loadTimeZoneNames(tzID, status);
        if (U_FAILURE(status)) { return; }
    }
    U_ASSERT(tznames != NULL);

    // Load the values into the dest array
    for (int i = 0; i < numTypes; i++) {
        UTimeZoneNameType type = types[i];
        const UChar* name = ((ZNames*)tznames)->getName(type);
        if (name == NULL) {
            if (mznames == NULL) {
                // Load the meta zone name
                UnicodeString mzID;
                getMetaZoneID(tzID, date, mzID);
                if (mzID.isEmpty()) {
                    mznames = (void*) EMPTY;
                } else {
                    // Load the meta zone strings
                    // Mutex is scoped to the "else" statement
                    Mutex lock(&gDataMutex);
                    mznames = (void*) nonConstThis->loadMetaZoneNames(mzID, status);
                    if (U_FAILURE(status)) { return; }
                    // Note: when the metazone doesn't exist, in Java, loadMetaZoneNames returns
                    // a dummy object instead of NULL.
                    if (mznames == NULL) {
                        mznames = (void*) EMPTY;
                    }
                }
            }
            U_ASSERT(mznames != NULL);
            if (mznames != EMPTY) {
                name = ((ZNames*)mznames)->getName(type);
            }
        }
        if (name != NULL) {
            dest[i].setTo(TRUE, name, -1);
        } else {
            dest[i].setToBogus();
        }
    }
}